

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall google::protobuf::internal::DynamicMapField::Clear(DynamicMapField *this)

{
  void **ppvVar1;
  RepeatedPtrField<google::protobuf::Message> *pRVar2;
  Rep *pRVar3;
  long lVar4;
  long lVar5;
  iterator iter;
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_40;
  
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
            ((iterator *)&local_40,&this->map_);
  if (local_40.node_ != (Node *)0x0) {
    do {
      MapValueRef::DeleteData(&(((local_40.node_)->kv).v_)->second);
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
      iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
      ::operator++(&local_40);
    } while (local_40.node_ != (Node *)0x0);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(&this->map_);
  pRVar2 = (this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.repeated_field_;
  if ((pRVar2 != (RepeatedPtrField<google::protobuf::Message> *)0x0) &&
     (lVar5 = (long)(pRVar2->super_RepeatedPtrFieldBase).current_size_, 0 < lVar5)) {
    pRVar3 = (pRVar2->super_RepeatedPtrFieldBase).rep_;
    lVar4 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar4;
      lVar4 = lVar4 + 1;
      (**(code **)(**ppvVar1 + 0x38))();
    } while (lVar5 != lVar4);
    (pRVar2->super_RepeatedPtrFieldBase).current_size_ = 0;
  }
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.state_._M_i = STATE_MODIFIED_MAP;
  return;
}

Assistant:

void DynamicMapField::Clear() {
  Map<MapKey, MapValueRef>* map = &const_cast<DynamicMapField*>(this)->map_;
  for (Map<MapKey, MapValueRef>::iterator iter = map->begin();
       iter != map->end(); ++iter) {
    iter->second.DeleteData();
  }
  map->clear();

  if (MapFieldBase::repeated_field_ != nullptr) {
    MapFieldBase::repeated_field_->Clear();
  }
  // Data in map and repeated field are both empty, but we can't set status
  // CLEAN which will invalidate previous reference to map.
  MapFieldBase::SetMapDirty();
}